

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O0

bool flow::transform::eliminateUnusedInstr(IRHandler *handler)

{
  bool bVar1;
  LiteralType LVar2;
  element_type *this;
  IRBuiltinFunction *this_00;
  NativeCallback *this_01;
  CallInstr *local_98;
  undefined1 local_88 [16];
  CallInstr *f;
  Instr *instr;
  iterator __end3;
  iterator __begin3;
  UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
  *__range3;
  BasicBlock *bb;
  iterator __end2;
  iterator __begin2;
  UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
  *__range2;
  IRHandler *handler_local;
  
  ___begin2 = IRHandler::basicBlocks_abi_cxx11_(handler);
  __end2 = util::
           UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
           ::begin((UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
                    *)&__begin2);
  bb = (BasicBlock *)
       util::
       UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
       ::end((UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
              *)&__begin2);
  do {
    bVar1 = util::
            UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
            ::iterator::operator!=(&__end2,(iterator *)&bb);
    if (!bVar1) {
      return false;
    }
    this = util::
           UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
           ::iterator::operator*(&__end2);
    ___begin3 = BasicBlock::instructions(this);
    __end3 = util::
             UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
             ::begin((UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                      *)&__begin3);
    instr = (Instr *)util::
                     UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                     ::end((UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                            *)&__begin3);
    while (bVar1 = util::
                   UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
                   ::iterator::operator!=(&__end3,(iterator *)&instr), bVar1) {
      f = (CallInstr *)
          util::
          UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
          ::iterator::operator*(&__end3);
      if ((element_type *)f == (element_type *)0x0) {
        local_98 = (CallInstr *)0x0;
      }
      else {
        local_98 = (CallInstr *)__dynamic_cast(f,&Instr::typeinfo,&CallInstr::typeinfo,0);
      }
      local_88._8_8_ = local_98;
      if (local_98 != (CallInstr *)0x0) {
        this_00 = CallInstr::callee(local_98);
        this_01 = IRBuiltinFunction::getNative(this_00);
        bVar1 = NativeCallback::isReadOnly(this_01);
        if (((bVar1) && (LVar2 = Value::type((Value *)f), LVar2 != Void)) &&
           (bVar1 = Value::isUsed((Value *)f), !bVar1)) {
          BasicBlock::remove((BasicBlock *)local_88,(char *)this);
          std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr
                    ((unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)local_88);
          return true;
        }
      }
      util::
      UnboxedRange<std::vector<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>_>
      ::iterator::operator++(&__end3);
    }
    util::
    UnboxedRange<std::__cxx11::list<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>_>
    ::iterator::operator++(&__end2);
  } while( true );
}

Assistant:

bool eliminateUnusedInstr(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    for (Instr* instr : bb->instructions()) {
      if (auto f = dynamic_cast<CallInstr*>(instr)) {
        if (f->callee()->getNative().isReadOnly()) {
          if (instr->type() != LiteralType::Void && !instr->isUsed()) {
            bb->remove(instr);
            return true;
          }
        }
      }
    }
  }
  return false;
}